

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

bool __thiscall cmCPackGenerator::ReadListFile(cmCPackGenerator *this,char *moduleName)

{
  cmMakefile *this_00;
  bool bVar1;
  byte local_9a;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string fullPath;
  bool retval;
  char *moduleName_local;
  cmCPackGenerator *this_local;
  
  this_00 = this->MakefileMap;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,moduleName,&local_61);
  cmMakefile::GetModulesFile((string *)local_40,this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  fullPath.field_2._M_local_buf[0xf] =
       cmMakefile::ReadListFile(this->MakefileMap,(string *)local_40);
  local_9a = 0;
  if ((bool)fullPath.field_2._M_local_buf[0xf]) {
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    local_9a = bVar1 ^ 0xff;
  }
  fullPath.field_2._M_local_buf[0xf] = local_9a & 1;
  std::__cxx11::string::~string((string *)local_40);
  return (bool)(local_9a & 1);
}

Assistant:

bool cmCPackGenerator::ReadListFile(const char* moduleName)
{
  bool retval;
  std::string fullPath = this->MakefileMap->GetModulesFile(moduleName);
  retval = this->MakefileMap->ReadListFile(fullPath);
  // include FATAL_ERROR and ERROR in the return status
  retval = retval && (!cmSystemTools::GetErrorOccurredFlag());
  return retval;
}